

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_receiver.c
# Opt level: O0

apx_error_t
apx_fileManagerReceiver_write
          (apx_fileManagerReceiver_t *self,apx_fileManagerReceptionResult_t *result,uint32_t address
          ,uint8_t *data,apx_size_t size,_Bool more_bit)

{
  apx_error_t local_3c;
  apx_error_t retval;
  _Bool more_bit_local;
  apx_size_t size_local;
  uint8_t *data_local;
  uint32_t address_local;
  apx_fileManagerReceptionResult_t *result_local;
  apx_fileManagerReceiver_t *self_local;
  
  if ((((self == (apx_fileManagerReceiver_t *)0x0) ||
       (result == (apx_fileManagerReceptionResult_t *)0x0)) || (data == (uint8_t *)0x0)) ||
     (0x7ffffffe < address)) {
    self_local._4_4_ = 1;
  }
  else {
    if (size < 0x1000001) {
      result->is_complete = false;
      result->address = 0x7fffffff;
      result->data = (uint8_t *)0x0;
      result->size = 0;
      if (self->start_address == 0x7fffffff) {
        local_3c = start_new_reception(self,result,address,data,size,more_bit);
      }
      else {
        local_3c = continue_reception(self,result,address,data,size,more_bit);
      }
    }
    else {
      local_3c = 0x20;
    }
    self_local._4_4_ = local_3c;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_fileManagerReceiver_write(apx_fileManagerReceiver_t* self, apx_fileManagerReceptionResult_t* result, uint32_t address, uint8_t const* data, apx_size_t size, bool more_bit)
{
   if ( (self != NULL) && (result != NULL) && (data != NULL) && (address < RMF_INVALID_ADDRESS) )
   {
      apx_error_t retval = APX_NO_ERROR;
      if (size > APX_MAX_FILE_SIZE)
      {
         retval = APX_FILE_TOO_LARGE_ERROR;
      }
      else
      {
         result->is_complete = false;
         result->address = RMF_INVALID_ADDRESS;
         result->data = NULL;
         result->size = 0u;

         if (self->start_address == RMF_INVALID_ADDRESS)
         {
            retval = start_new_reception(self, result, address, data, size, more_bit);
         }
         else
         {
            retval = continue_reception(self, result, address, data, size, more_bit);
         }
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}